

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

ON_MeshNgon * __thiscall
ON_MeshNgonBuffer::CreateFromTriangle
          (ON_MeshNgonBuffer *this,uint *triangle_vertex_indices,uint face_index)

{
  uint local_38;
  uint local_34;
  uint quad_vertex_indices [4];
  uint face_index_local;
  uint *triangle_vertex_indices_local;
  ON_MeshNgonBuffer *this_local;
  
  quad_vertex_indices[3] = face_index;
  if (triangle_vertex_indices == (uint *)0x0) {
    this_local = (ON_MeshNgonBuffer *)ON_MeshNgon::NgonFromMeshFace(this,face_index,(uint *)0x0);
  }
  else {
    local_38 = *triangle_vertex_indices;
    local_34 = triangle_vertex_indices[1];
    quad_vertex_indices[0] = triangle_vertex_indices[2];
    quad_vertex_indices[1] = 0;
    this_local = (ON_MeshNgonBuffer *)ON_MeshNgon::NgonFromMeshFace(this,face_index,&local_38);
  }
  return (ON_MeshNgon *)this_local;
}

Assistant:

const class ON_MeshNgon* ON_MeshNgonBuffer::CreateFromTriangle(
  const unsigned int triangle_vertex_indices[3],
  unsigned int face_index
  )
{
  if ( 0 != triangle_vertex_indices )
  {
    const unsigned int quad_vertex_indices[4] = {
      triangle_vertex_indices[0],
      triangle_vertex_indices[1],
      triangle_vertex_indices[2],
      0
    };
    return ON_MeshNgon::NgonFromMeshFace(*this,face_index,quad_vertex_indices);
  }
  return ON_MeshNgon::NgonFromMeshFace(*this,face_index,0);
}